

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackwardPass.cpp
# Opt level: O2

void __thiscall BackwardPass::InvalidateCloneStrCandidate(BackwardPass *this,Opnd *opnd)

{
  StackSym *pSVar1;
  code *pcVar2;
  bool bVar3;
  RegOpnd *pRVar4;
  undefined4 *puVar5;
  
  pRVar4 = IR::Opnd::AsRegOpnd(opnd);
  if (pRVar4 == (RegOpnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                       ,0x1857,"(regOpnd != nullptr)","regOpnd != nullptr");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
  }
  if (this->tag == BackwardPhase) {
    pSVar1 = pRVar4->m_sym;
    if ((this->currentInstr->m_opcode == Add_A) &&
       (pRVar4 = IR::Opnd::AsRegOpnd(this->currentInstr->m_src1),
       (pRVar4->m_sym->super_Sym).m_id == (pSVar1->super_Sym).m_id)) {
      return;
    }
    if (((this->currentPrePassLoop == (Loop *)0x0) && (this->isCollectionPass == false)) &&
       (this->currentBlock->loop != (Loop *)0x0)) {
      BVSparse<Memory::JitArenaAllocator>::Clear
                (this->currentBlock->cloneStrCandidates,(pSVar1->super_Sym).m_id);
      return;
    }
  }
  return;
}

Assistant:

void
BackwardPass::InvalidateCloneStrCandidate(IR::Opnd * opnd)
{
    IR::RegOpnd *regOpnd = opnd->AsRegOpnd();
    Assert(regOpnd != nullptr);
    StackSym *sym = regOpnd->m_sym;

    if (tag == Js::BackwardPhase &&
        (currentInstr->m_opcode != Js::OpCode::Add_A || currentInstr->GetSrc1()->AsRegOpnd()->m_sym->m_id != sym->m_id) &&
        !this->IsPrePass() &&
        !this->IsCollectionPass() &&
        this->currentBlock->loop)
    {
            currentBlock->cloneStrCandidates->Clear(sym->m_id);
    }
}